

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark3.cpp
# Opt level: O1

void __thiscall Codecc::Codecc(Codecc *this,size_t maxPacketSize)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Buffer *pBVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  unsigned_long local_48;
  unsigned_long local_40;
  Buffer *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  undefined1 local_19;
  
  this->w = 0;
  this->r = 0;
  (this->buffer).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buffer).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->maxPacketSize = maxPacketSize;
  local_48 = maxPacketSize * 2;
  local_38 = (element_type *)0x0;
  local_40 = local_48;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<hwnet::Buffer,std::allocator<hwnet::Buffer>,unsigned_long&,unsigned_long&>
            (a_Stack_30,&local_38,(allocator<hwnet::Buffer> *)&local_19,&local_48,&local_40);
  _Var2._M_pi = a_Stack_30[0]._M_pi;
  pBVar1 = local_38;
  local_38 = (Buffer *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->buffer).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (this->buffer).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pBVar1;
  (this->buffer).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  return;
}

Assistant:

Codecc(size_t maxPacketSize):w(0),r(0),maxPacketSize(maxPacketSize) {
		this->buffer = Buffer::New(maxPacketSize*2,maxPacketSize*2);
	}